

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotring.cpp
# Opt level: O1

void __thiscall HotRingInstance::HotRing::HotRing(HotRing *this,size_t sz)

{
  ulong uVar1;
  ulong __new_size;
  
  this->r = 0;
  this->findcnt = 0;
  this->maxFindcnt = 0;
  this->minFindcnt = 0x7fffffffffffffff;
  (this->table).
  super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table).
  super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table).
  super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = 1;
  do {
    __new_size = uVar1;
    uVar1 = __new_size * 2;
  } while (__new_size < sz);
  std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::resize
            (&this->table,__new_size);
  this->hash_mask = __new_size - 1;
  return;
}

Assistant:

HotRing::HotRing(size_t sz):table(0), findcnt(0), minFindcnt(LONG_MAX), maxFindcnt(0) {
        size_t htsz = 1;
        while (htsz < sz) htsz <<= 1;   // 把容量扩充为参数的整数次幂
        table.resize(htsz);
        hash_mask = htsz - 1;
    }